

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterAllocTombstone(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  undefined4 *puVar2;
  long *in_RSI;
  Fts5TombstoneArray *pNew;
  int nByte;
  int nTomb;
  sqlite3_int64 in_stack_ffffffffffffffd8;
  
  iVar1 = *(int *)(*in_RSI + 0x20);
  if ((0 < iVar1) &&
     (puVar2 = (undefined4 *)
               sqlite3Fts5MallocZero((int *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffd8),
     puVar2 != (undefined4 *)0x0)) {
    puVar2[1] = iVar1;
    *puVar2 = 1;
    in_RSI[5] = (long)puVar2;
  }
  return;
}

Assistant:

static void fts5SegIterAllocTombstone(Fts5Index *p, Fts5SegIter *pIter){
  const int nTomb = pIter->pSeg->nPgTombstone;
  if( nTomb>0 ){
    int nByte = nTomb * sizeof(Fts5Data*) + sizeof(Fts5TombstoneArray);
    Fts5TombstoneArray *pNew;
    pNew = (Fts5TombstoneArray*)sqlite3Fts5MallocZero(&p->rc, nByte);
    if( pNew ){
      pNew->nTombstone = nTomb;
      pNew->nRef = 1;
      pIter->pTombArray = pNew;
    }
  }
}